

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_localport(OperationConfig *config,char *nextarg)

{
  char cVar1;
  ParameterError PVar2;
  ulong uVar3;
  int iVar4;
  long *val;
  ParameterError PVar5;
  char *pcVar6;
  char *pcVar7;
  char buffer [22];
  char acStack_48 [32];
  
  iVar4 = -1;
  pcVar6 = nextarg;
  do {
    pcVar7 = pcVar6;
    cVar1 = *pcVar7;
    pcVar6 = pcVar7 + 1;
    iVar4 = iVar4 + 1;
  } while ((byte)(cVar1 - 0x30U) < 10);
  if (cVar1 == '\0') {
    pcVar7 = (char *)0x0;
  }
  else {
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      cVar1 = *pcVar6;
      pcVar7 = pcVar6;
    }
    if (cVar1 != '-') {
      return PARAM_BAD_USE;
    }
    if ((pcVar7[1] == ' ') || (pcVar7[1] == '\t')) {
      pcVar7 = pcVar7 + 2;
    }
    else {
      pcVar7 = pcVar7 + 1;
    }
  }
  curl_msnprintf(acStack_48,0x16,"%.*s",iVar4,nextarg);
  PVar2 = str2unummax(&config->localport,acStack_48,0xffff);
  PVar5 = PARAM_BAD_USE;
  if (PVar2 == PARAM_OK) {
    val = &config->localportrange;
    if (pcVar7 == (char *)0x0) {
      *val = 1;
    }
    else {
      PVar2 = str2unummax(val,pcVar7,0xffff);
      if (PVar2 != PARAM_OK) {
        return PARAM_BAD_USE;
      }
      uVar3 = *val - config->localport;
      *val = uVar3 + 1;
      if (0x7ffffffffffffffe < uVar3) {
        return PARAM_BAD_USE;
      }
    }
    PVar5 = PARAM_OK;
  }
  return PVar5;
}

Assistant:

static ParameterError parse_localport(struct OperationConfig *config,
                                      const char *nextarg)
{
  const char *pp = NULL;
  const char *p = nextarg;
  char buffer[22];
  size_t plen = 0;
  while(ISDIGIT(*p))
    p++;
  plen = p - nextarg;
  if(*p) {
    pp = p;
    /* check for ' - [end]' */
    if(ISBLANK(*pp))
      pp++;
    if(*pp != '-')
      return PARAM_BAD_USE;
    pp++;
    if(ISBLANK(*pp))
      pp++;
  }
  msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, nextarg);
  if(str2unummax(&config->localport, buffer, 65535))
    return PARAM_BAD_USE;
  if(!pp)
    config->localportrange = 1; /* default number of ports to try */
  else {
    if(str2unummax(&config->localportrange, pp, 65535))
      return PARAM_BAD_USE;
    config->localportrange -= (config->localport-1);
    if(config->localportrange < 1)
      return PARAM_BAD_USE;
  }
  return PARAM_OK;
}